

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Routing.cpp
# Opt level: O0

int Routing::GetFloatParameterCallback
              (UnityAudioEffectState *state,int index,float *value,char *valuestr)

{
  EffectData *pEVar1;
  EffectData *data;
  char *valuestr_local;
  float *value_local;
  int index_local;
  UnityAudioEffectState *state_local;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<Routing::EffectData>(state);
  if (index < 1) {
    if (value != (float *)0x0) {
      *value = pEVar1[index].p[0];
    }
    if (valuestr != (char *)0x0) {
      *valuestr = '\0';
    }
    state_local._4_4_ = 0;
  }
  else {
    state_local._4_4_ = 1;
  }
  return state_local._4_4_;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK GetFloatParameterCallback(UnityAudioEffectState* state, int index, float* value, char *valuestr)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        if (value != NULL)
            *value = data->p[index];
        if (valuestr != NULL)
            valuestr[0] = 0;
        return UNITY_AUDIODSP_OK;
    }